

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

BtorSimBitVector * btorsim_bv_sext(BtorSimBitVector *bv,uint32_t len)

{
  uint32_t uVar1;
  BtorSimBitVector *pBVar2;
  BtorSimBitVector *in_RDI;
  BtorSimBitVector *unaff_retaddr;
  BtorSimBitVector *tmp;
  BtorSimBitVector *res;
  uint32_t msb;
  undefined8 in_stack_ffffffffffffffe0;
  uint32_t bw;
  
  bw = (uint32_t)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  uVar1 = btorsim_bv_get_bit(in_RDI,in_RDI->width - 1);
  if (uVar1 == 0) {
    btorsim_bv_new(bw);
  }
  else {
    btorsim_bv_ones(bw);
  }
  pBVar2 = btorsim_bv_concat(unaff_retaddr,in_RDI);
  btorsim_bv_free((BtorSimBitVector *)0x13b94f);
  return pBVar2;
}

Assistant:

BtorSimBitVector *
btorsim_bv_sext (const BtorSimBitVector *bv, uint32_t len)
{
  assert (bv);
  assert (len > 0);

  uint32_t msb;
  BtorSimBitVector *res, *tmp;

  msb = btorsim_bv_get_bit (bv, bv->width - 1);
  tmp = msb ? btorsim_bv_ones (len) : btorsim_bv_zero (len);
  res = btorsim_bv_concat (tmp, bv);
  btorsim_bv_free (tmp);
  assert (rem_bits_zero_dbg (res));
  return res;
}